

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O0

Entity * __thiscall Entity::getName_abi_cxx11_(Entity *this)

{
  long in_RSI;
  Entity *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x20));
  return this;
}

Assistant:

string Entity::getName(){
    return name;
}